

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

int fmt::v7::detail::
    get_dynamic_spec<fmt::v7::detail::precision_checker,fmt::v7::basic_format_arg<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>,fmt::v7::detail::error_handler>
              (error_handler *param_1)

{
  int iStack0000000000000008;
  long arg;
  undefined4 in_stack_00000018;
  
  switch(in_stack_00000018) {
  case 1:
    _iStack0000000000000008 = (ulong)iStack0000000000000008;
    if ((long)_iStack0000000000000008 < 0) {
LAB_0019673d:
      error_handler::on_error(param_1,"negative precision");
    }
    goto LAB_00196754;
  case 2:
    _iStack0000000000000008 = _iStack0000000000000008 & 0xffffffff;
    break;
  case 3:
    if ((long)_iStack0000000000000008 < 0) goto LAB_0019673d;
    break;
  case 5:
    if (arg < 0) goto LAB_0019673d;
  case 4:
  case 6:
    break;
  default:
    error_handler::on_error(param_1,"precision is not integer");
  }
  if (_iStack0000000000000008 >> 0x1f != 0) {
    error_handler::on_error(param_1,"number is too big");
  }
LAB_00196754:
  return (int)_iStack0000000000000008;
}

Assistant:

FMT_CONSTEXPR int get_dynamic_spec(FormatArg arg, ErrorHandler eh) {
  unsigned long long value = visit_format_arg(Handler<ErrorHandler>(eh), arg);
  if (value > to_unsigned(max_value<int>())) eh.on_error("number is too big");
  return static_cast<int>(value);
}